

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.cpp
# Opt level: O2

raw_ostream * llvm::operator<<(raw_ostream *OS,HexNumber *Value)

{
  raw_ostream *this;
  undefined1 in_CL;
  string local_40;
  
  this = raw_ostream::operator<<(OS,"0x");
  to_hexString_abi_cxx11_(&local_40,(llvm *)Value->Value,1,(bool)in_CL);
  raw_ostream::operator<<(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return OS;
}

Assistant:

raw_ostream &operator<<(raw_ostream &OS, const HexNumber &Value) {
  OS << "0x" << to_hexString(Value.Value);
  return OS;
}